

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::InstanceSymbol::serializeTo(InstanceSymbol *this,ASTSerializer *serializer)

{
  PortConnection *this_00;
  long lVar1;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> sVar2;
  string_view name;
  string_view name_00;
  
  if (this->canonicalBody == (InstanceBodySymbol *)0x0) {
    ASTSerializer::write(serializer,4,"body",(size_t)this->body);
  }
  else {
    name._M_str = "body";
    name._M_len = 4;
    ASTSerializer::writeLink(serializer,name,&this->canonicalBody->super_Symbol);
  }
  name_00._M_str = "connections";
  name_00._M_len = 0xb;
  ASTSerializer::startArray(serializer,name_00);
  sVar2 = getPortConnections(this);
  for (lVar1 = 0; sVar2._M_extent._M_extent_value._M_extent_value << 3 != lVar1; lVar1 = lVar1 + 8)
  {
    this_00 = *(PortConnection **)((long)sVar2._M_ptr + lVar1);
    ASTSerializer::startObject(serializer);
    PortConnection::serializeTo(this_00,serializer);
    ASTSerializer::endObject(serializer);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void InstanceSymbol::serializeTo(ASTSerializer& serializer) const {
    if (canonicalBody)
        serializer.writeLink("body", *canonicalBody);
    else
        serializer.write("body", body);

    serializer.startArray("connections");
    for (auto conn : getPortConnections()) {
        serializer.startObject();
        conn->serializeTo(serializer);
        serializer.endObject();
    }
    serializer.endArray();
}